

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ArithmeticalExpression *expression)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  SubtreeWrapper *pSVar4;
  SubtreeWrapper *pSVar5;
  ExpressionWrapper *this_00;
  BinopExpression *pBVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionWrapper *this_01;
  ConstExpression *this_02;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  if (&expression->lhs_->super_Node == (Node *)0x0) {
    this_01 = (ExpressionWrapper *)operator_new(0x10);
    this_02 = (ConstExpression *)operator_new(0x10);
    IRT::ConstExpression::ConstExpression(this_02,0);
    IRT::ExpressionWrapper::ExpressionWrapper(this_01,(Expression *)this_02);
    pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    this_00 = (ExpressionWrapper *)operator_new(0x10);
    pBVar6 = (BinopExpression *)operator_new(0x20);
    iVar2 = (*(this_01->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])(this_01);
    iVar3 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
    IRT::BinopExpression::BinopExpression
              (pBVar6,MINUS,(Expression *)CONCAT44(extraout_var_01,iVar2),
               (Expression *)CONCAT44(extraout_var_02,iVar3));
    IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
  }
  else {
    psVar1 = &expression->operation_;
    pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->lhs_->super_Node);
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      this_00 = (ExpressionWrapper *)operator_new(0x10);
      pBVar6 = (BinopExpression *)operator_new(0x20);
      iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
      iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])(pSVar5);
      IRT::BinopExpression::BinopExpression
                (pBVar6,PLUS,(Expression *)CONCAT44(extraout_var_03,iVar2),
                 (Expression *)CONCAT44(extraout_var_04,iVar3));
      IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        this_00 = (ExpressionWrapper *)operator_new(0x10);
        pBVar6 = (BinopExpression *)operator_new(0x20);
        iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
        iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])(pSVar5);
        IRT::BinopExpression::BinopExpression
                  (pBVar6,MINUS,(Expression *)CONCAT44(extraout_var_05,iVar2),
                   (Expression *)CONCAT44(extraout_var_06,iVar3));
        IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 == 0) {
          this_00 = (ExpressionWrapper *)operator_new(0x10);
          pBVar6 = (BinopExpression *)operator_new(0x20);
          iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
          iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])(pSVar5);
          IRT::BinopExpression::BinopExpression
                    (pBVar6,MUL,(Expression *)CONCAT44(extraout_var_07,iVar2),
                     (Expression *)CONCAT44(extraout_var_08,iVar3));
          IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar2 == 0) {
            this_00 = (ExpressionWrapper *)operator_new(0x10);
            pBVar6 = (BinopExpression *)operator_new(0x20);
            iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
            iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])(pSVar5);
            IRT::BinopExpression::BinopExpression
                      (pBVar6,DIV,(Expression *)CONCAT44(extraout_var_09,iVar2),
                       (Expression *)CONCAT44(extraout_var_10,iVar3));
            IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar2 != 0) {
              return;
            }
            this_00 = (ExpressionWrapper *)operator_new(0x10);
            pBVar6 = (BinopExpression *)operator_new(0x20);
            iVar2 = (*pSVar4->_vptr_SubtreeWrapper[2])(pSVar4);
            iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])(pSVar5);
            IRT::BinopExpression::BinopExpression
                      (pBVar6,MOD,(Expression *)CONCAT44(extraout_var,iVar2),
                       (Expression *)CONCAT44(extraout_var_00,iVar3));
            IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)pBVar6);
          }
        }
      }
    }
  }
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = &this_00->super_SubtreeWrapper;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ArithmeticalExpression* expression) {
  const std::string& op = expression->operation_;

  if (expression->lhs_ == nullptr) {
    auto lhs = new IRT::ExpressionWrapper(new IRT::ConstExpression(0));
    auto rhs = Accept(expression->rhs_);

    tos_value_ = new IRT::ExpressionWrapper(
        new IRT::BinopExpression(IRT::BinaryOperatorType::MINUS,
                                 lhs->ToExpression(), rhs->ToExpression()));
  } else {
    auto lhs = Accept(expression->lhs_);
    auto rhs = Accept(expression->rhs_);

    if (op == "+") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "-") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MINUS,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "*") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MUL,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "/") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::DIV,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "%") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MOD,
                                   lhs->ToExpression(), rhs->ToExpression()));
    }
  }
}